

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsOpcodeSafeToDelete(Instruction *this)

{
  bool bVar1;
  Op OVar2;
  IRContext *this_00;
  Instruction *this_local;
  
  this_00 = context(this);
  bVar1 = IRContext::IsCombinatorInstruction(this_00,this);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    OVar2 = opcode(this);
    if ((OVar2 == OpImageQueryLod) || (OVar2 - OpDPdx < 9)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Instruction::IsOpcodeSafeToDelete() const {
  if (context()->IsCombinatorInstruction(this)) {
    return true;
  }

  switch (opcode()) {
    case spv::Op::OpDPdx:
    case spv::Op::OpDPdy:
    case spv::Op::OpFwidth:
    case spv::Op::OpDPdxFine:
    case spv::Op::OpDPdyFine:
    case spv::Op::OpFwidthFine:
    case spv::Op::OpDPdxCoarse:
    case spv::Op::OpDPdyCoarse:
    case spv::Op::OpFwidthCoarse:
    case spv::Op::OpImageQueryLod:
      return true;
    default:
      return false;
  }
}